

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

pair<unsigned_int,_unsigned_int> __thiscall
llvm::SourceMgr::getLineAndColumn(SourceMgr *this,SMLoc Loc,uint BufferID)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  unsigned_short uVar4;
  uint uVar5;
  pointer pMVar6;
  size_t sVar7;
  pair<unsigned_int,_unsigned_long> pVar8;
  unsigned_long local_98;
  pair<unsigned_int,_unsigned_long> local_90;
  StringRef local_80;
  StringRef local_70;
  size_type local_60;
  size_t NewlineOffs;
  char *BufStart;
  size_t sStack_48;
  uint LineNo;
  size_t Sz;
  char *Ptr;
  SrcBuffer *SB;
  uint local_24;
  SourceMgr *pSStack_20;
  uint BufferID_local;
  SourceMgr *this_local;
  SMLoc Loc_local;
  
  local_24 = BufferID;
  pSStack_20 = this;
  this_local = (SourceMgr *)Loc.Ptr;
  if (BufferID == 0) {
    SB = (SrcBuffer *)Loc.Ptr;
    local_24 = FindBufferContainingLoc(this,Loc);
  }
  if (local_24 != 0) {
    Ptr = (char *)getBufferInfo(this,local_24);
    Sz = (size_t)SMLoc::getPointer((SMLoc *)&this_local);
    pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->((unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
                        Ptr);
    sVar7 = MemoryBuffer::getBufferSize(pMVar6);
    sStack_48 = sVar7;
    bVar3 = std::numeric_limits<unsigned_char>::max();
    uVar1 = sStack_48;
    if (bVar3 < sVar7) {
      uVar4 = std::numeric_limits<unsigned_short>::max();
      uVar2 = sStack_48;
      if (uVar4 < uVar1) {
        uVar5 = std::numeric_limits<unsigned_int>::max();
        if (uVar5 < uVar2) {
          BufStart._4_4_ = SrcBuffer::getLineNumber<unsigned_long>((SrcBuffer *)Ptr,(char *)Sz);
        }
        else {
          BufStart._4_4_ = SrcBuffer::getLineNumber<unsigned_int>((SrcBuffer *)Ptr,(char *)Sz);
        }
      }
      else {
        BufStart._4_4_ = SrcBuffer::getLineNumber<unsigned_short>((SrcBuffer *)Ptr,(char *)Sz);
      }
    }
    else {
      BufStart._4_4_ = SrcBuffer::getLineNumber<unsigned_char>((SrcBuffer *)Ptr,(char *)Sz);
    }
    pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->((unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
                        Ptr);
    NewlineOffs = (size_t)MemoryBuffer::getBufferStart(pMVar6);
    StringRef::StringRef(&local_70,(char *)NewlineOffs,Sz - NewlineOffs);
    StringRef::StringRef(&local_80,"\n\r");
    local_60 = StringRef::find_last_of(&local_70,local_80,0xffffffffffffffff);
    if (local_60 == 0xffffffffffffffff) {
      local_60 = 0xffffffffffffffff;
    }
    local_98 = (Sz - NewlineOffs) - local_60;
    pVar8 = std::make_pair<unsigned_int&,unsigned_long>((uint *)((long)&BufStart + 4),&local_98);
    local_90.second = pVar8.second;
    local_90.first = pVar8.first;
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_long,_true>
              ((pair<unsigned_int,_unsigned_int> *)&Loc_local,&local_90);
    return (pair<unsigned_int,_unsigned_int>)Loc_local.Ptr;
  }
  __assert_fail("BufferID && \"Invalid Location!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                ,0x80,
                "std::pair<unsigned int, unsigned int> llvm::SourceMgr::getLineAndColumn(SMLoc, unsigned int) const"
               );
}

Assistant:

std::pair<unsigned, unsigned>
SourceMgr::getLineAndColumn(SMLoc Loc, unsigned BufferID) const {
  if (!BufferID)
    BufferID = FindBufferContainingLoc(Loc);
  assert(BufferID && "Invalid Location!");

  auto &SB = getBufferInfo(BufferID);
  const char *Ptr = Loc.getPointer();

  size_t Sz = SB.Buffer->getBufferSize();
  unsigned LineNo;
  if (Sz <= std::numeric_limits<uint8_t>::max())
    LineNo = SB.getLineNumber<uint8_t>(Ptr);
  else if (Sz <= std::numeric_limits<uint16_t>::max())
    LineNo = SB.getLineNumber<uint16_t>(Ptr);
  else if (Sz <= std::numeric_limits<uint32_t>::max())
    LineNo = SB.getLineNumber<uint32_t>(Ptr);
  else
    LineNo = SB.getLineNumber<uint64_t>(Ptr);

  const char *BufStart = SB.Buffer->getBufferStart();
  size_t NewlineOffs = StringRef(BufStart, Ptr-BufStart).find_last_of("\n\r");
  if (NewlineOffs == StringRef::npos) NewlineOffs = ~(size_t)0;
  return std::make_pair(LineNo, Ptr-BufStart-NewlineOffs);
}